

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O3

BOOL __thiscall
Js::TypedArray<char,_false,_true>::DirectSetItemNoSet
          (TypedArray<char,_false,_true> *this,uint32 index,Var value)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (((ulong)value & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)value & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)value & 0xffff000000000000) != 0x1000000000000) {
      JavascriptConversion::ToInt32_Full
                (value,(((((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                           super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).
                        ptr)->super_JavascriptLibraryBase).scriptContext.ptr);
      goto LAB_00d73db5;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00d73de5;
    *puVar3 = 0;
  }
  if (((ulong)value & 0x1ffff00000000) != 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) {
LAB_00d73de5:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
LAB_00d73db5:
  if (((this->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->isDetached != true) {
    return 0;
  }
  JavascriptError::ThrowTypeError
            ((((((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                 super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ebe5,(PCWSTR)0x0);
}

Assistant:

inline BOOL Int8VirtualArray::DirectSetItemNoSet(__in uint32 index, __in Js::Var value)
    {
        return BaseTypedDirectSetItemNoSet(index, value, JavascriptConversion::ToInt8);
    }